

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBFunctionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  SchemaCatalogEntry *pSVar1;
  pointer prVar2;
  CatalogEntry *pCVar3;
  long lVar4;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> _Var5;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  _Var6;
  type pDVar7;
  pointer pDVar8;
  ulong uVar9;
  CatalogEntry *pCVar10;
  pointer prVar11;
  pointer prVar12;
  pointer *__ptr;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  pointer prVar13;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Head_base<0UL,_duckdb::DuckDBFunctionsData_*,_false> local_78;
  type local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )context;
  local_78._M_head_impl = (DuckDBFunctionsData *)operator_new(0x30);
  ((local_78._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBFunctionsData_02459ba8;
  ((local_78._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_78._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_78._M_head_impl)->entries).
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78._M_head_impl)->offset = 0;
  (local_78._M_head_impl)->offset_in_entry = 0;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar12 = local_48.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar1 = prVar12->_M_data;
      pDVar7 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                            *)&local_78);
      local_68 = 0;
      local_58 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
                 ::_M_invoke;
      local_60 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:98:14)>
                 ::_M_manager;
      local_70 = pDVar7;
      (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar1,input,0x1a,&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      local_68 = 0;
      local_58 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
                 ::_M_invoke;
      local_60 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:100:14)>
                 ::_M_manager;
      local_70 = pDVar7;
      (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar1,input,0x19,&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      local_68 = 0;
      local_58 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
                 ::_M_invoke;
      local_60 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_functions.cpp:102:14)>
                 ::_M_manager;
      local_70 = pDVar7;
      (*(pSVar1->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar1,input,0x1c,&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      prVar12 = prVar12 + 1;
    } while (prVar12 !=
             local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pDVar8 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_78);
  prVar11 = (pDVar8->entries).
            super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar8 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                         *)&local_78);
  prVar2 = (pDVar8->entries).
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar11 != prVar2) {
    uVar9 = (long)prVar2 - (long)prVar11 >> 3;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
              (prVar11,prVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)prVar2 - (long)prVar11 < 0x81) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar11,prVar2);
    }
    else {
      prVar13 = prVar11 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>>
                (prVar11,prVar13);
      for (; prVar13 != prVar2; prVar13 = prVar13 + 1) {
        pCVar10 = prVar13[-1]._M_data;
        pCVar3 = prVar13->_M_data;
        prVar11 = prVar13;
        if (pCVar3->type < pCVar10->type) {
          do {
            prVar11->_M_data = pCVar10;
            pCVar10 = prVar11[-2]._M_data;
            prVar11 = prVar11 + -1;
          } while (pCVar3->type < pCVar10->type);
        }
        prVar11->_M_data = pCVar3;
      }
    }
  }
  _Var6._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  _Var5._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (DuckDBFunctionsData *)0x0;
  *(DuckDBFunctionsData **)
   local_50._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       _Var5._M_head_impl;
  if ((local_48.
       super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
     (operator_delete(local_48.
                      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start),
     local_78._M_head_impl != (DuckDBFunctionsData *)0x0)) {
    (*((local_78._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var6._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBFunctionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBFunctionsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		ExtractFunctionsFromSchema(context, schema.get(), *result);
	};

	std::sort(result->entries.begin(), result->entries.end(),
	          [&](reference<CatalogEntry> a, reference<CatalogEntry> b) {
		          return (int32_t)a.get().type < (int32_t)b.get().type;
	          });
	return std::move(result);
}